

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall
PrintC::buildTypeStack
          (PrintC *this,Datatype *ct,
          vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *typestack)

{
  type_metatype tVar1;
  long lVar2;
  FuncProto *this_00;
  FuncProto *proto;
  vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *typestack_local;
  Datatype *ct_local;
  PrintC *this_local;
  
  typestack_local = (vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *)ct;
  ct_local = (Datatype *)this;
  while( true ) {
    while( true ) {
      while( true ) {
        std::vector<const_Datatype_*,_std::allocator<const_Datatype_*>_>::push_back
                  (typestack,(value_type *)&typestack_local);
        Datatype::getName_abi_cxx11_((Datatype *)typestack_local);
        lVar2 = std::__cxx11::string::size();
        if (lVar2 != 0) {
          return;
        }
        tVar1 = Datatype::getMetatype((Datatype *)typestack_local);
        if (tVar1 != TYPE_PTR) break;
        typestack_local =
             (vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *)
             TypePointer::getPtrTo((TypePointer *)typestack_local);
      }
      tVar1 = Datatype::getMetatype((Datatype *)typestack_local);
      if (tVar1 != TYPE_ARRAY) break;
      typestack_local =
           (vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *)
           TypeArray::getBase((TypeArray *)typestack_local);
    }
    tVar1 = Datatype::getMetatype((Datatype *)typestack_local);
    if (tVar1 != TYPE_CODE) break;
    this_00 = TypeCode::getPrototype((TypeCode *)typestack_local);
    if (this_00 == (FuncProto *)0x0) {
      typestack_local =
           (vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *)
           TypeFactory::getTypeVoid(((this->super_PrintLanguage).glb)->types);
    }
    else {
      typestack_local =
           (vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *)
           FuncProto::getOutputType(this_00);
    }
  }
  return;
}

Assistant:

void PrintC::buildTypeStack(const Datatype *ct,vector<const Datatype *> &typestack)

{
  for(;;) {
    typestack.push_back(ct);
    if (ct->getName().size() != 0)	// This can be a base type
      break;
    if (ct->getMetatype()==TYPE_PTR)
      ct = ((TypePointer *)ct)->getPtrTo();
    else if (ct->getMetatype()==TYPE_ARRAY)
      ct = ((TypeArray *)ct)->getBase();
    else if (ct->getMetatype()==TYPE_CODE) {
      const FuncProto *proto = ((TypeCode *)ct)->getPrototype();
      if (proto != (const FuncProto *)0)
	ct = proto->getOutputType();
      else
	ct = glb->types->getTypeVoid();
    }
    else
      break;			// Some other anonymous type
  }
}